

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertWCharTImpl
          (anon_unknown_53 *this,wchar_t v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  ulong uVar1;
  bool bVar2;
  ulong in_RAX;
  FormatSinkImpl *this_00;
  byte bVar3;
  uint uVar4;
  int in_register_00000034;
  size_t sVar5;
  undefined1 uVar6;
  uint uVar7;
  string_view value;
  string_view v_00;
  char mb [4];
  undefined8 uStack_8;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  uVar7 = (uint)this;
  uVar6 = SUB81(this,0);
  uStack_8._5_3_ = (undefined3)(in_RAX >> 0x28);
  uStack_8._0_4_ = (undefined4)in_RAX;
  if (uVar7 < 0x80) {
    uStack_8._0_5_ = CONCAT14(uVar6,(undefined4)uStack_8);
    sVar5 = 1;
  }
  else {
    uStack_8._6_2_ = (undefined2)(in_RAX >> 0x30);
    if (uVar7 < 0x800) {
      uStack_8 = CONCAT26(uStack_8._6_2_,
                          CONCAT15(uVar6,CONCAT14((char)((ulong)this >> 6),(undefined4)uStack_8))) &
                 0xffff3fffffffffff | 0x80c000000000;
      sVar5 = 2;
    }
    else if (uVar7 < 0xd800 || (uVar7 & 0xffffe000) == 0xe000) {
      uVar1 = CONCAT26(uStack_8._6_2_,
                       CONCAT15((char)((ulong)this >> 6),
                                CONCAT14((char)((ulong)this >> 0xc),(undefined4)uStack_8))) &
              0xffff3fffffffffff;
      uStack_8._7_1_ = (undefined1)(uVar1 >> 0x38);
      uStack_8 = CONCAT17(uStack_8._7_1_,CONCAT16(uVar6,(int6)uVar1)) & 0xff3fffffffffffff |
                 0x8080e000000000;
      sVar5 = 3;
    }
    else {
      if (0xfffff < uVar7 - 0x10000) {
        bVar2 = true;
        sVar5 = 0xffffffffffffffff;
        uVar1 = in_RAX;
        if (uVar7 < 0xdc00) {
          uVar4 = ((uint)((ulong)this >> 6) & 0xf) + 1;
          uStack_8 = CONCAT26(uStack_8._6_2_,
                              CONCAT15((byte)(uVar7 >> 2) & 0xf | (byte)((uVar4 & 3) << 4),
                                       CONCAT14((byte)uVar4 >> 2,(undefined4)uStack_8))) |
                     0x80f000000000;
          sVar5 = 2;
          uVar1 = uStack_8;
        }
        goto LAB_00383fcd;
      }
      uStack_8 = CONCAT17(uVar6,CONCAT16((char)((ulong)this >> 6),
                                         CONCAT15((char)((ulong)this >> 0xc),
                                                  CONCAT14((char)((ulong)this >> 0x12),
                                                           (undefined4)uStack_8)))) &
                 0x3f3f3fffffffffff | 0x808080f000000000;
      sVar5 = 4;
    }
  }
  bVar2 = false;
  uVar1 = uStack_8;
LAB_00383fcd:
  uStack_8 = uVar1;
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar3 = (byte)((uint)v >> 8);
    if (bVar3 == 0) {
      v_00._M_str = (char *)((long)&uStack_8 + 4);
      v_00._M_len = sVar5;
      FormatSinkImpl::Append(this_00,v_00);
      bVar2 = true;
    }
    else {
      value._M_str = (char *)((long)&uStack_8 + 4);
      value._M_len = sVar5;
      bVar2 = FormatSinkImpl::PutPaddedString
                        (this_00,value,in_register_00000034,conv._0_4_,(bool)(bVar3 & 1));
    }
  }
  return bVar2;
}

Assistant:

bool ConvertWCharTImpl(wchar_t v, const FormatConversionSpecImpl conv,
                       FormatSinkImpl *sink) {
  char mb[4];
  ShiftState s;
  const size_t chars_written = WideToUtf8(v, mb, s);
  return chars_written != static_cast<size_t>(-1) && !s.saw_high_surrogate &&
         ConvertStringArg(string_view(mb, chars_written), conv, sink);
}